

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::Initialize<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  SerializedResourceSignatureImpl *pSVar1;
  IPipelineResourceSignature *pObj;
  ARCHIVE_DEVICE_DATA_FLAGS AVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  IMemoryAllocator *Allocator;
  char (*Args_1) [14];
  long lVar5;
  IPipelineResourceSignature **ppIVar6;
  ARCHIVE_DEVICE_DATA_FLAGS AVar7;
  IPipelineResourceSignature *DefaultSignatures [1];
  string msg;
  string msg_1;
  Serializer<(Diligent::SerializerMode)2> Ser;
  anon_class_24_3_3c7a8e98 SerializePsoCI;
  
  AVar2 = ArchiveInfo->DeviceFlags;
  AVar7 = AVar2 & ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
  if ((~AVar2 & 0xc) != 0) {
    AVar7 = AVar2;
  }
  (this->m_Data).Aux.NoShaderReflection =
       (bool)((char)ArchiveInfo->PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION);
  while (AVar7 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
    AVar2 = -AVar7 & AVar7;
    AVar7 = AVar7 ^ AVar2;
    uVar3 = AVar2 << 0x1e | AVar2 >> 2;
    if (uVar3 - 1 < 2) {
      PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
    }
    else if (uVar3 == 0) {
      FormatString<char[53]>
                (&msg,(char (*) [53])"ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,0xeb);
      std::__cxx11::string::~string((string *)&msg);
    }
    else if (uVar3 == 4) {
      PatchShadersVk<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
    }
    else {
      FormatString<char[30]>(&msg,(char (*) [30])"Unexpected render device type");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if ((this->m_Data).Common.m_Ptr == (void *)0x0) {
    uVar3 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
    if (uVar3 == 0) {
      if ((ArchiveInfo->DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GLES|ARCHIVE_DEVICE_DATA_FLAG_GL))
          == ARCHIVE_DEVICE_DATA_FLAG_NONE) {
        uVar3 = 0;
      }
      else {
        PrepareDefaultSignatureGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
        uVar3 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      }
    }
    else {
      (this->m_Data).DoNotPackSignatures = (bool)((byte)(char)ArchiveInfo->PSOFlags >> 1 & 1);
    }
    ppIVar6 = (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
    DefaultSignatures[0] = (IPipelineResourceSignature *)0x0;
    pSVar1 = (this->m_pDefaultSignature).m_pObject;
    if (pSVar1 != (SerializedResourceSignatureImpl *)0x0) {
      ppIVar6 = DefaultSignatures;
      uVar3 = 1;
      DefaultSignatures[0] = (IPipelineResourceSignature *)pSVar1;
    }
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
    ::resize(&this->m_Signatures,(ulong)uVar3);
    for (lVar5 = 0; SerializePsoCI.PRSNames = (TPRSNames *)&msg, (ulong)uVar3 << 3 != lVar5;
        lVar5 = lVar5 + 8) {
      pObj = *(IPipelineResourceSignature **)((long)ppIVar6 + lVar5);
      if (pObj == (IPipelineResourceSignature *)0x0) {
        FormatString<char[71]>
                  (&msg_1,(char (*) [71])
                          "This error should\'ve been caught by ValidatePipelineResourceSignatures")
        ;
        DebugAssertionFailed
                  (msg_1._M_dataplus._M_p,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                   ,0x116);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      RefCntAutoPtr<Diligent::IPipelineResourceSignature>::operator=
                ((RefCntAutoPtr<Diligent::IPipelineResourceSignature> *)
                 ((long)&((this->m_Signatures).
                          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_pObject + lVar5),pObj);
      iVar4 = (*(pObj->super_IDeviceObject).super_IObject._vptr_IObject[4])(pObj);
      *(undefined8 *)((long)&msg._M_dataplus._M_p + lVar5) =
           *(undefined8 *)CONCAT44(extraout_var,iVar4);
    }
    Ser.m_Start = (TPointer)0x0;
    Ser.m_End = (TPointer)0xffffffff;
    Ser.m_Ptr = (TPointer)0x0;
    SerializePsoCI.CreateInfo = CreateInfo;
    SerializePsoCI.this = this;
    Initialize<Diligent::ComputePipelineStateCreateInfo>(Diligent::ComputePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&SerializePsoCI,&Ser);
    Allocator = GetRawAllocator();
    Serializer<(Diligent::SerializerMode)2>::AllocateData((SerializedData *)&msg_1,&Ser,Allocator);
    SerializedData::operator=(&(this->m_Data).Common,(SerializedData *)&msg_1);
    SerializedData::~SerializedData((SerializedData *)&msg_1);
    Ser.m_Start = (TPointer)(this->m_Data).Common.m_Ptr;
    Args_1 = (char (*) [14])(Ser.m_Start + (this->m_Data).Common.m_Size);
    Ser.m_End = (TPointer)Args_1;
    Ser.m_Ptr = Ser.m_Start;
    Initialize<Diligent::ComputePipelineStateCreateInfo>(Diligent::ComputePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&SerializePsoCI,
               (Serializer<(Diligent::SerializerMode)1> *)&Ser);
    if (Ser.m_Ptr != Ser.m_End) {
      FormatString<char[26],char[14]>
                (&msg_1,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6d36a8,Args_1);
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,299);
      std::__cxx11::string::~string((string *)&msg_1);
    }
  }
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
  UNLOCK();
  return;
}

Assistant:

void SerializedPipelineStateImpl::Initialize(const PSOCreateInfoType&        CreateInfo,
                                             const PipelineStateArchiveInfo& ArchiveInfo)
{
    auto DeviceBits = ArchiveInfo.DeviceFlags;
    if ((DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GL) != 0 && (DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GLES) != 0)
    {
        // OpenGL and GLES use the same device data. Clear one flag to avoid shader duplication.
        DeviceBits &= ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
    }

    m_Data.Aux.NoShaderReflection = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION) != 0;
    while (DeviceBits != 0)
    {
        const auto Flag = ExtractLSB(DeviceBits);

        static_assert(ARCHIVE_DEVICE_DATA_FLAG_LAST == 1 << 7, "Please update the switch below to handle the new data type");
        switch (Flag)
        {
#if D3D11_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
                PatchShadersD3D11(CreateInfo);
                break;
#endif
#if D3D12_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
                PatchShadersD3D12(CreateInfo);
                break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_GL:
            case ARCHIVE_DEVICE_DATA_FLAG_GLES:
                PatchShadersGL(CreateInfo);
                break;
#endif
#if VULKAN_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
                PatchShadersVk(CreateInfo);
                break;
#endif
#if METAL_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
                PatchShadersMtl(CreateInfo, ArchiveDeviceDataFlagToArchiveDeviceType(Flag),
                                GetPSODumpFolder(m_pSerializationDevice->GetMtlProperties().DumpFolder, GetDesc(), Flag));
                break;
#endif
#if WEBGPU_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
                PatchShadersWebGPU(CreateInfo);
                break;
#endif
            case ARCHIVE_DEVICE_DATA_FLAG_NONE:
                UNEXPECTED("ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
                break;

            default:
                LOG_ERROR_MESSAGE("Unexpected render device type");
                break;
        }
    }

    if (!m_Data.Common)
    {
        if (CreateInfo.ResourceSignaturesCount == 0)
        {
#if GL_SUPPORTED || GLES_SUPPORTED
            if (ArchiveInfo.DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GL | ARCHIVE_DEVICE_DATA_FLAG_GLES))
            {
                // We must add empty device signature for OpenGL after all other devices are processed,
                // otherwise this empty description will be used as common signature description.
                PrepareDefaultSignatureGL(CreateInfo);
            }
#endif
        }
        else
        {
            m_Data.DoNotPackSignatures = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_DO_NOT_PACK_SIGNATURES) != 0;
        }

        auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;
        auto** ppSignatures    = CreateInfo.ppResourceSignatures;

        IPipelineResourceSignature* DefaultSignatures[1] = {};
        if (m_pDefaultSignature)
        {
            DefaultSignatures[0] = m_pDefaultSignature;
            ppSignatures         = DefaultSignatures;
            SignaturesCount      = 1;
        }

        TPRSNames PRSNames = {};
        m_Signatures.resize(SignaturesCount);
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            auto* pSignature = ppSignatures[i];
            VERIFY(pSignature != nullptr, "This error should've been caught by ValidatePipelineResourceSignatures");
            m_Signatures[i] = pSignature;
            PRSNames[i]     = pSignature->GetDesc().Name;
        }

        auto SerializePsoCI = [&](auto& Ser) //
        {
            SerializePSOCreateInfo(Ser, CreateInfo, PRSNames);
            constexpr auto SerMode = std::remove_reference<decltype(Ser)>::type::GetMode();
            PSOSerializer<SerMode>::SerializeAuxData(Ser, m_Data.Aux, nullptr);
        };

        {
            Serializer<SerializerMode::Measure> Ser;
            SerializePsoCI(Ser);
            m_Data.Common = Ser.AllocateData(GetRawAllocator());
        }

        {
            Serializer<SerializerMode::Write> Ser{m_Data.Common};
            SerializePsoCI(Ser);
            VERIFY_EXPR(Ser.IsEnded());
        }
    }

    m_Status.store(PIPELINE_STATE_STATUS_READY);
}